

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

NDevice * __thiscall
TrodesConfig::getDevice(NDevice *__return_storage_ptr__,TrodesConfig *this,int index)

{
  pointer pNVar1;
  pointer pcVar2;
  int iVar3;
  
  pNVar1 = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (index < (int)((ulong)((long)(this->devices).
                                  super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pNVar1) >> 3) *
              0x38e38e39) {
    (__return_storage_ptr__->super_NetworkDataType)._vptr_NetworkDataType =
         (_func_int **)&PTR__NDevice_003edce8;
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    pcVar2 = pNVar1[index].name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->name,pcVar2,
               pcVar2 + pNVar1[index].name._M_string_length);
    iVar3 = pNVar1[index].byteOffset;
    __return_storage_ptr__->numBytes = pNVar1[index].numBytes;
    __return_storage_ptr__->byteOffset = iVar3;
    std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::vector
              (&__return_storage_ptr__->channels,&pNVar1[index].channels);
  }
  else {
    NDevice::NDevice(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

NDevice TrodesConfig::getDevice(int index) const{
    if (index >= (int)devices.size()) {
        return NDevice();
    }
    return devices[index];
}